

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void sprite_evaluation(uint16_t scanline,uint16_t dot,uint8_t sprite_size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  _Bool _Var3;
  _Bool _Var4;
  byte bVar5;
  undefined2 in_register_00000032;
  
  _Var4 = primary_overflow;
  _Var3 = secondary_overflow;
  uVar2 = secondary_OAM_addr;
  uVar1 = oam_data;
  if (CONCAT22(in_register_00000032,dot) == 0x41) {
    sprite_overflow = 0;
    secondary_overflow = false;
    primary_overflow = false;
    secondary_OAM_addr = '\0';
LAB_0010c453:
    oam_data = primary_OAM[primary_OAM_addr];
    return;
  }
  if ((dot & 1) != 0) goto LAB_0010c453;
  if (secondary_overflow || primary_overflow) {
    oam_data = secondary_OAM[secondary_OAM_addr];
  }
  else {
    secondary_OAM[secondary_OAM_addr] = oam_data;
  }
  if (sprite_evaluation::bytes_left_to_copy != '\0') {
    sprite_evaluation::bytes_left_to_copy = sprite_evaluation::bytes_left_to_copy + 0xff;
LAB_0010c48b:
    primary_OAM_addr = primary_OAM_addr + '\x01';
    primary_overflow = primary_OAM_addr == '\0';
    secondary_OAM_addr = uVar2 + '\x01';
    secondary_overflow = secondary_OAM_addr == '\0';
    overflow_detection = secondary_OAM_addr == '\0';
    return;
  }
  if (dot == 0x42) {
    sprite0_on_next_scanline = (ushort)(scanline - uVar1) < (ushort)sprite_size;
  }
  if ((ushort)(scanline - uVar1) < (ushort)sprite_size) {
    if (!_Var3 && !_Var4) {
      sprite_evaluation::bytes_left_to_copy = '\x03';
      goto LAB_0010c48b;
    }
    if (overflow_detection == false) goto LAB_0010c517;
    if (!_Var4) {
      sprite_overflow = 1;
      overflow_detection = false;
      return;
    }
  }
  else if (overflow_detection == false) {
LAB_0010c517:
    primary_OAM_addr = (primary_OAM_addr & 0xfc) + 4;
    bVar5 = primary_OAM_addr;
    goto joined_r0x0010c527;
  }
  bVar5 = (primary_OAM_addr & 0xfc) + 4;
  primary_OAM_addr = primary_OAM_addr + 1 & 3 | bVar5;
joined_r0x0010c527:
  if (bVar5 == 0) {
    primary_overflow = true;
  }
  return;
}

Assistant:

void sprite_evaluation(uint16_t scanline, uint16_t dot, uint8_t sprite_size) {
    static uint8_t bytes_left_to_copy = 0;

    if(dot == 65) {
        primary_overflow = secondary_overflow = sprite_overflow = false;
        set_secondary_OAM_address(0);
    }
    if(is_odd_cycle(dot)) {
        oam_data = primary_OAM[primary_OAM_addr];
        return;
    }

    uint8_t const orig_oam_data = oam_data;

    if(!is_OAM_overflow())
        secondary_OAM[secondary_OAM_addr] = oam_data;
    else
        oam_data = secondary_OAM[secondary_OAM_addr];

    if(bytes_left_to_copy > 0) {
        bytes_left_to_copy--;
        increment_OAM_addresses();
        return;
    }

    bool const in_range = sprite_in_range(scanline, orig_oam_data, sprite_size);

    if(dot == 66)
        sprite0_on_next_scanline = in_range;

    if(in_range && !is_OAM_overflow()) {
        bytes_left_to_copy = 3;
        increment_OAM_addresses();
        return;
    }

    if(!overflow_detection) {
        primary_OAM_addr = (primary_OAM_addr + 4) & 0xFC;
        if(primary_OAM_addr == 0)
            primary_overflow = true;
    }
    else {
        if(in_range && !primary_overflow) {
            sprite_overflow = true;
            overflow_detection = false;
        }
        else {
            primary_OAM_addr = ((primary_OAM_addr + 4) & 0xFC) | ((primary_OAM_addr + 1) & 0x3);
            if((primary_OAM_addr & 0xFC) == 0)
                primary_overflow = true;
        }
    }
}